

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O1

void __thiscall
cfdcapi_transaction_FundRawTransaction_Check1_Test::TestBody
          (cfdcapi_transaction_FundRawTransaction_Check1_Test *this)

{
  pointer pCVar1;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  allocator_type *in_RCX;
  size_type extraout_RDX;
  long lVar6;
  char *pcVar7;
  char *in_R9;
  pointer pCVar8;
  initializer_list<CfdTestFundElementsUtxoVector> __l;
  int64_t tx_fee_amount;
  int ret;
  char *output_tx_hex;
  char *str_buffer;
  AssertHelper local_5b8;
  AssertionResult gtest_ar_;
  undefined1 local_5a0 [16];
  void *fund_handle;
  void *handle;
  AssertHelper local_580;
  uint32_t append_txout_count;
  AssertionResult gtest_ar;
  undefined1 local_560 [16];
  undefined4 local_550;
  undefined1 *local_548;
  string local_540;
  undefined1 *local_520 [2];
  undefined1 local_510 [16];
  undefined1 *local_500 [2];
  undefined1 local_4f0 [16];
  undefined4 local_4e0;
  undefined1 *local_4d8;
  string local_4d0;
  undefined1 *local_4b0 [2];
  undefined1 local_4a0 [16];
  undefined1 *local_490 [2];
  undefined1 local_480 [16];
  undefined4 local_470;
  undefined1 *local_468;
  string local_460;
  undefined1 *local_440 [2];
  undefined1 local_430 [16];
  undefined1 *local_420 [2];
  undefined1 local_410 [16];
  undefined4 local_400;
  undefined1 *local_3f8;
  string local_3f0;
  undefined1 *local_3d0 [2];
  undefined1 local_3c0 [16];
  undefined1 *local_3b0 [2];
  undefined1 local_3a0 [16];
  undefined4 local_390;
  undefined1 *local_388;
  string local_380;
  undefined1 *local_360 [2];
  undefined1 local_350 [16];
  undefined1 *local_340 [2];
  undefined1 local_330 [16];
  undefined4 local_320;
  undefined8 local_318;
  string local_310;
  undefined1 *local_2f0 [2];
  undefined1 local_2e0 [16];
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined4 local_2b0;
  undefined1 *local_2a8;
  string local_2a0;
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  undefined4 local_240;
  undefined1 *local_238;
  string local_230;
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined4 local_1d0;
  undefined1 *local_1c8;
  string local_1c0;
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  undefined4 local_160;
  undefined1 *local_158;
  string local_150;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined4 local_f0;
  undefined1 *local_e8;
  string local_e0;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined4 local_80;
  undefined1 *local_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (TestBody()::exp_dummy_asset_a == '\0') {
    iVar5 = __cxa_guard_acquire(&TestBody()::exp_dummy_asset_a);
    if (iVar5 != 0) {
      gtest_ar._0_8_ = local_560;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&gtest_ar,
                 "aa00000000000000000000000000000000000000000000000000000000000000","");
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                (&TestBody::exp_dummy_asset_a,(string *)&gtest_ar);
      if ((undefined1 *)gtest_ar._0_8_ != local_560) {
        operator_delete((void *)gtest_ar._0_8_);
      }
      __cxa_atexit(cfd::core::ConfidentialAssetId::~ConfidentialAssetId,&TestBody::exp_dummy_asset_a
                   ,&__dso_handle);
      __cxa_guard_release(&TestBody()::exp_dummy_asset_a);
    }
  }
  if (TestBody()::exp_dummy_asset_b == '\0') {
    iVar5 = __cxa_guard_acquire(&TestBody()::exp_dummy_asset_b);
    if (iVar5 != 0) {
      gtest_ar._0_8_ = local_560;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&gtest_ar,
                 "bb00000000000000000000000000000000000000000000000000000000000000","");
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                (&TestBody::exp_dummy_asset_b,(string *)&gtest_ar);
      if ((undefined1 *)gtest_ar._0_8_ != local_560) {
        operator_delete((void *)gtest_ar._0_8_);
      }
      __cxa_atexit(cfd::core::ConfidentialAssetId::~ConfidentialAssetId,&TestBody::exp_dummy_asset_b
                   ,&__dso_handle);
      __cxa_guard_release(&TestBody()::exp_dummy_asset_b);
    }
  }
  if (TestBody()::exp_dummy_asset_c == '\0') {
    iVar5 = __cxa_guard_acquire(&TestBody()::exp_dummy_asset_c);
    if (iVar5 != 0) {
      gtest_ar._0_8_ = local_560;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&gtest_ar,
                 "cc00000000000000000000000000000000000000000000000000000000000000","");
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                (&TestBody::exp_dummy_asset_c,(string *)&gtest_ar);
      if ((undefined1 *)gtest_ar._0_8_ != local_560) {
        operator_delete((void *)gtest_ar._0_8_);
      }
      __cxa_atexit(cfd::core::ConfidentialAssetId::~ConfidentialAssetId,&TestBody::exp_dummy_asset_c
                   ,&__dso_handle);
      __cxa_guard_release(&TestBody()::exp_dummy_asset_c);
    }
  }
  if (TestBody()::kFundCoinSelectElementsTestVector3 == '\0') {
    iVar5 = __cxa_guard_acquire(&TestBody()::kFundCoinSelectElementsTestVector3);
    if (iVar5 != 0) {
      gtest_ar._0_8_ = local_560;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&gtest_ar,
                 "7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a","");
      local_550 = 0;
      local_548 = &DAT_12a05f20;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_540,&TestBody::exp_dummy_asset_a);
      local_520[0] = local_510;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_520,
                 "sh(wpkh(0329165ca5832de80305c92d4b1415f10340d267ba05cbffcfe02d386dc5020e4d))","");
      local_500[0] = local_4f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_500,
                 "30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a","");
      local_4e0 = 0;
      local_4d8 = &DAT_04a817c8;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_4d0,&TestBody::exp_dummy_asset_a);
      local_4b0[0] = local_4a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4b0,
                 "sh(wpkh(022db3cb17d98db6cd8d513f88b095dbe80ef9e57acd5b1d9e8bd7f24618079451))","");
      local_490[0] = local_480;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_490,
                 "9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a","");
      local_470 = 0;
      local_468 = &DAT_4a817c80;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_460,&TestBody::exp_dummy_asset_a);
      local_440[0] = local_430;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_440,
                 "sh(wpkh(032d04e0b1474a82ad68c0ef37e1a7cf6c75ef01b22c00882e8e4e127a942823a1))","");
      local_420[0] = local_410;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_420,
                 "8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a","");
      local_400 = 0;
      local_3f8 = &DAT_02540be4;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_3f0,&TestBody::exp_dummy_asset_a);
      local_3d0[0] = local_3c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3d0,
                 "sh(wpkh(03a7fb569db921abf70f1b6b9ad9ac863196deecd99d606b139bba7d740d1cc5bf))","");
      local_3b0[0] = local_3a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3b0,
                 "4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a","");
      local_390 = 0;
      local_388 = &DAT_09502f90;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_380,&TestBody::exp_dummy_asset_a);
      local_360[0] = local_350;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_360,
                 "sh(wpkh(02df74fc8124ff6f3982e90afb318f3e955b10f58c4c6014b3a767e16160f811d9))","");
      local_340[0] = local_330;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_340,
                 "b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b","");
      local_320 = 0;
      local_318 = 2500000000;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_310,&TestBody::exp_dummy_asset_a);
      local_2f0[0] = local_2e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2f0,
                 "sh(wpkh(029222484db385d268a2a4604ea40fd2228401061f741ad9da8c907ba9df29c2d3))","");
      local_2d0[0] = local_2c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d0,
                 "0000000000000000000000000000000000000000000000000000000000000b01","");
      local_2b0 = 0;
      local_2a8 = &DAT_019abe00;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_2a0,&TestBody::exp_dummy_asset_b);
      local_280[0] = local_270;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_280,
                 "sh(wpkh(038f9011753b74fa0134d4b64a1491f99e0c4c0e16da616627c1f6a93c5e7555c0))","");
      local_260[0] = local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,
                 "0000000000000000000000000000000000000000000000000000000000000b02","");
      local_240 = 0;
      local_238 = &DAT_000b71b0;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_230,&TestBody::exp_dummy_asset_b);
      local_210[0] = local_200;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,
                 "sh(wpkh(0302f567f9671b570dbcf179f3ba5f2fb381ea7e8db6ab9e0968c07d40325c3fcd))","");
      local_1f0[0] = local_1e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f0,
                 "0000000000000000000000000000000000000000000000000000000000000b03","");
      local_1d0 = 0;
      local_1c8 = &DAT_14a61a62;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_1c0,&TestBody::exp_dummy_asset_b);
      local_1a0[0] = local_190;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,
                 "sh(wpkh(034ff60d8fb18ae88019f6f905cfaa0e1841f75edfa1f3c0a5bfaf77b796243901))","");
      local_180[0] = local_170;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,
                 "0000000000000000000000000000000000000000000000000000000000000b04","");
      local_160 = 0;
      local_158 = &DAT_0119ed3e;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_150,&TestBody::exp_dummy_asset_b);
      local_130[0] = local_120;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_130,
                 "sh(wpkh(029f2126cd8b55af7cc3cee8154c44de7cb7cb214809f81144d6b323d9c7a3993e))","");
      local_110[0] = local_100;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,
                 "0000000000000000000000000000000000000000000000000000000000000c01","");
      local_f0 = 0;
      local_e8 = &DAT_023e8eb8;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_e0,&TestBody::exp_dummy_asset_c);
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,
                 "sh(wpkh(02f1d2c28388e3fd609ff383f022b615f1cd8a1931632706f63bfb6e253875ca03))","");
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,
                 "0000000000000000000000000000000000000000000000000000000000000c02","");
      local_80 = 0;
      local_78 = &DAT_079252f0;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_70,&TestBody::exp_dummy_asset_c);
      local_50[0] = local_40;
      pcVar7 = "sh(wpkh(02cca4482dc1e7d54c879c0d9069e3d66c3bf91b2bf46eddc74f18d76c659dfd10))";
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,
                 "sh(wpkh(02cca4482dc1e7d54c879c0d9069e3d66c3bf91b2bf46eddc74f18d76c659dfd10))","");
      __l._M_len = extraout_RDX;
      __l._M_array = (iterator)pcVar7;
      std::vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>::
      vector((vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
              *)&gtest_ar,__l,in_RCX);
      lVar6 = 0x4d0;
      do {
        TestBody::CfdTestFundElementsUtxoVector::~CfdTestFundElementsUtxoVector
                  ((CfdTestFundElementsUtxoVector *)(local_560 + lVar6 + -0x10));
        lVar6 = lVar6 + -0x70;
      } while (lVar6 != -0x70);
      __cxa_atexit(std::
                   vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
                   ::~vector,&TestBody::kFundCoinSelectElementsTestVector3,&__dso_handle);
      __cxa_guard_release(&TestBody()::kFundCoinSelectElementsTestVector3);
    }
  }
  if (TestBody()::kExpTxData_abi_cxx11_ == '\0') {
    iVar5 = __cxa_guard_acquire(&TestBody()::kExpTxData_abi_cxx11_);
    if (iVar5 != 0) {
      TestBody()::kExpTxData_abi_cxx11_._M_dataplus._M_p =
           (pointer)&TestBody()::kExpTxData_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&TestBody()::kExpTxData_abi_cxx11_,
                 "010000000006fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000feffffff030b0000000000000000000000000000000000000000000000000000000000000000000000feffffff020b0000000000000000000000000000000000000000000000000000000000000000000000feffffff010c0000000000000000000000000000000000000000000000000000000000000000000000feffffff050100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a572430100000000000000000000000000000000000000000000000000000000000000aa01000000000000026a00000100000000000000000000000000000000000000000000000000000000000000bb010000000014b18c12001600148aff8eea7bef9ec60d35d7034b2e48e180e93c5d0100000000000000000000000000000000000000000000000000000000000000cc0100000000023e8eb800160014799a8d3f11251b6a6df4ba156a28dd64ad969a910100000000000000000000000000000000000000000000000000000000000000aa010000000006fc2142001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000"
                 ,"");
      __cxa_atexit(std::__cxx11::string::~string,&TestBody()::kExpTxData_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&TestBody()::kExpTxData_abi_cxx11_);
    }
  }
  CfdInitialize();
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  gtest_ar_._0_8_ = (ulong)(uint)gtest_ar_._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fund_handle,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x703,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fund_handle,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fund_handle);
    if (gtest_ar_._0_8_ != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_.success_ = handle != (void *)0x0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&fund_handle);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx_fee_amount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x704,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&tx_fee_amount,(Message *)&fund_handle);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx_fee_amount);
    if ((undefined1 *)gtest_ar._0_8_ != local_560) {
      operator_delete((void *)gtest_ar._0_8_);
    }
    if (fund_handle != (void *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (fund_handle != (void *)0x0)) {
        (**(code **)(*fund_handle + 8))();
      }
      fund_handle = (void *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)&gtest_ar,&TestBody::exp_dummy_asset_a);
  fund_handle = (void *)0x0;
  ret = CfdInitializeFundRawTx(handle,10,3,(char *)gtest_ar._0_8_,&fund_handle);
  tx_fee_amount = (ulong)tx_fee_amount._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee_amount,&ret);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&tx_fee_amount);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x70e,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&output_tx_hex,(Message *)&tx_fee_amount);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
    if (tx_fee_amount != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (tx_fee_amount != 0)) {
        (**(code **)(*(long *)tx_fee_amount + 8))();
      }
      tx_fee_amount = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  tx_fee_amount = 0;
  testing::internal::CmpHelperNE<decltype(nullptr),void*>
            ((internal *)&gtest_ar_,"nullptr","fund_handle",(void **)&tx_fee_amount,&fund_handle);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&tx_fee_amount);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x70f,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&output_tx_hex,(Message *)&tx_fee_amount);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
    if (tx_fee_amount != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (tx_fee_amount != 0)) {
        (**(code **)(*(long *)tx_fee_amount + 8))();
      }
      tx_fee_amount = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  pCVar1 = TestBody::kFundCoinSelectElementsTestVector3.
           super__Vector_base<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ret == 0) {
    if (TestBody::kFundCoinSelectElementsTestVector3.
        super__Vector_base<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        TestBody::kFundCoinSelectElementsTestVector3.
        super__Vector_base<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pCVar8 = TestBody::kFundCoinSelectElementsTestVector3.
               super__Vector_base<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        ret = CfdAddUtxoForFundRawTx
                        (handle,fund_handle,(pCVar8->txid)._M_dataplus._M_p,pCVar8->vout,
                         pCVar8->amount,(pCVar8->descriptor)._M_dataplus._M_p,
                         (pCVar8->asset)._M_dataplus._M_p);
        tx_fee_amount = tx_fee_amount & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee_amount,&ret);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&tx_fee_amount);
          pcVar7 = "";
          if (gtest_ar_.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x718,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&output_tx_hex,(Message *)&tx_fee_amount);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
          if (tx_fee_amount != 0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && (tx_fee_amount != 0)) {
              (**(code **)(*(long *)tx_fee_amount + 8))();
            }
            tx_fee_amount = 0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar_.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pCVar8 = pCVar8 + 1;
      } while (pCVar8 != pCVar1);
    }
    pvVar3 = handle;
    pvVar2 = fund_handle;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
              ((string *)&gtest_ar_,&TestBody::exp_dummy_asset_a);
    pcVar7 = "";
    ret = CfdAddTxInputForFundRawTx
                    (pvVar3,pvVar2,
                     "9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff",0,0x6b22c20,
                     "sh(wpkh([ef735203/0\'/0\'/7\']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x"
                     ,(char *)gtest_ar_._0_8_,false,false,false,"",0,0,(char *)0x0);
    if ((undefined1 *)gtest_ar_._0_8_ != local_5a0) {
      operator_delete((void *)gtest_ar_._0_8_);
    }
    tx_fee_amount = tx_fee_amount & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee_amount,&ret);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&tx_fee_amount);
      if (gtest_ar_.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x721,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&output_tx_hex,(Message *)&tx_fee_amount);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      if (tx_fee_amount != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (tx_fee_amount != 0)) {
          (**(code **)(*(long *)tx_fee_amount + 8))();
        }
        tx_fee_amount = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pvVar3 = handle;
    pvVar2 = fund_handle;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
              ((string *)&gtest_ar_,&TestBody::exp_dummy_asset_a);
    ret = CfdAddTargetAmountForFundRawTx
                    (pvVar3,pvVar2,0,0x6e6f7c0,(char *)gtest_ar_._0_8_,
                     "ex1qdnf34k9c255nfa9anjx0sj5ne0t6f80p5rne4e");
    if ((undefined1 *)gtest_ar_._0_8_ != local_5a0) {
      operator_delete((void *)gtest_ar_._0_8_);
    }
    tx_fee_amount = tx_fee_amount & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee_amount,&ret);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&tx_fee_amount);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x726,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&output_tx_hex,(Message *)&tx_fee_amount);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      if (tx_fee_amount != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (tx_fee_amount != 0)) {
          (**(code **)(*(long *)tx_fee_amount + 8))();
        }
        tx_fee_amount = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pvVar3 = handle;
    pvVar2 = fund_handle;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
              ((string *)&gtest_ar_,&TestBody::exp_dummy_asset_b);
    ret = CfdAddTargetAmountForFundRawTx
                    (pvVar3,pvVar2,1,0x14b18c08,(char *)gtest_ar_._0_8_,
                     "ex1q3tlca6nma70vvrf46up5ktjguxqwj0zamt7ktn");
    if ((undefined1 *)gtest_ar_._0_8_ != local_5a0) {
      operator_delete((void *)gtest_ar_._0_8_);
    }
    tx_fee_amount = tx_fee_amount & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee_amount,&ret);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&tx_fee_amount);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x72a,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&output_tx_hex,(Message *)&tx_fee_amount);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      if (tx_fee_amount != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (tx_fee_amount != 0)) {
          (**(code **)(*(long *)tx_fee_amount + 8))();
        }
        tx_fee_amount = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pvVar3 = handle;
    pvVar2 = fund_handle;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
              ((string *)&gtest_ar_,&TestBody::exp_dummy_asset_c);
    ret = CfdAddTargetAmountForFundRawTx
                    (pvVar3,pvVar2,2,0x23e8e54,(char *)gtest_ar_._0_8_,
                     "ex1q0xdg60c3y5dk5m05hg2k52xavjkedx53t3k40m");
    if ((undefined1 *)gtest_ar_._0_8_ != local_5a0) {
      operator_delete((void *)gtest_ar_._0_8_);
    }
    tx_fee_amount = tx_fee_amount & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee_amount,&ret);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&tx_fee_amount);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x72e,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&output_tx_hex,(Message *)&tx_fee_amount);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      if (tx_fee_amount != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (tx_fee_amount != 0)) {
          (**(code **)(*(long *)tx_fee_amount + 8))();
        }
        tx_fee_amount = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdSetOptionFundRawTx(handle,fund_handle,1,0,0.0,true);
    tx_fee_amount = tx_fee_amount & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee_amount,&ret);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&tx_fee_amount);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x732,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&output_tx_hex,(Message *)&tx_fee_amount);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      if (tx_fee_amount != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (tx_fee_amount != 0)) {
          (**(code **)(*(long *)tx_fee_amount + 8))();
        }
        tx_fee_amount = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    tx_fee_amount = 0;
    append_txout_count = 0;
    output_tx_hex = (char *)0x0;
    ret = CfdFinalizeFundRawTx
                    (handle,fund_handle,
                     "010000000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff010100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000"
                     ,0.15,&tx_fee_amount,&append_txout_count,&output_tx_hex);
    str_buffer = (char *)((ulong)str_buffer._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&str_buffer,&ret);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&str_buffer);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_5b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x73b,pcVar7);
      testing::internal::AssertHelper::operator=(&local_5b8,(Message *)&str_buffer);
      testing::internal::AssertHelper::~AssertHelper(&local_5b8);
      if (str_buffer != (char *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (str_buffer != (char *)0x0)) {
          (**(code **)(*(long *)str_buffer + 8))();
        }
        str_buffer = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      str_buffer = (char *)CONCAT44(str_buffer._4_4_,0x26a);
      testing::internal::CmpHelperEQ<int,long>
                ((internal *)&gtest_ar_,"618","tx_fee_amount",(int *)&str_buffer,&tx_fee_amount);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&str_buffer);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_5b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x73d,pcVar7);
        testing::internal::AssertHelper::operator=(&local_5b8,(Message *)&str_buffer);
        testing::internal::AssertHelper::~AssertHelper(&local_5b8);
        if (str_buffer != (char *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) && (str_buffer != (char *)0x0)) {
            (**(code **)(*(long *)str_buffer + 8))();
          }
          str_buffer = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      str_buffer = (char *)CONCAT44(str_buffer._4_4_,3);
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&gtest_ar_,"3","append_txout_count",(int *)&str_buffer,
                 &append_txout_count);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&str_buffer);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_5b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x73e,pcVar7);
        testing::internal::AssertHelper::operator=(&local_5b8,(Message *)&str_buffer);
        testing::internal::AssertHelper::~AssertHelper(&local_5b8);
        if (str_buffer != (char *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) && (str_buffer != (char *)0x0)) {
            (**(code **)(*(long *)str_buffer + 8))();
          }
          str_buffer = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar_,"kExpTxData.c_str()","output_tx_hex",
                 TestBody()::kExpTxData_abi_cxx11_._M_dataplus._M_p,output_tx_hex);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&str_buffer);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_5b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x73f,pcVar7);
        testing::internal::AssertHelper::operator=(&local_5b8,(Message *)&str_buffer);
        testing::internal::AssertHelper::~AssertHelper(&local_5b8);
        if (str_buffer != (char *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) && (str_buffer != (char *)0x0)) {
            (**(code **)(*(long *)str_buffer + 8))();
          }
          str_buffer = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(output_tx_hex);
    }
    else {
      ret = CfdGetLastErrorCode(handle);
      if (ret != 0) {
        str_buffer = (char *)0x0;
        ret = CfdGetLastErrorMessage(handle,&str_buffer);
        local_5b8.data_ = local_5b8.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&local_5b8,&ret);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_5b8);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_580,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x746,pcVar7);
          testing::internal::AssertHelper::operator=(&local_580,(Message *)&local_5b8);
          testing::internal::AssertHelper::~AssertHelper(&local_580);
          if (local_5b8.data_ != (AssertHelperData *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && (local_5b8.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_5b8.data_ + 8))();
            }
            local_5b8.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar_.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pcVar7 = "";
        testing::internal::CmpHelperSTREQ((internal *)&gtest_ar_,"\"\"","str_buffer","",str_buffer);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_5b8);
          if (gtest_ar_.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_580,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x747,pcVar7);
          testing::internal::AssertHelper::operator=(&local_580,(Message *)&local_5b8);
          testing::internal::AssertHelper::~AssertHelper(&local_580);
          if (local_5b8.data_ != (AssertHelperData *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && (local_5b8.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_5b8.data_ + 8))();
            }
            local_5b8.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar_.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        CfdFreeStringBuffer(str_buffer);
      }
    }
  }
  ret = CfdFreeFundRawTxHandle(handle,fund_handle);
  tx_fee_amount = tx_fee_amount & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee_amount,&ret);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&tx_fee_amount);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x74e,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&output_tx_hex,(Message *)&tx_fee_amount);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
    if (tx_fee_amount != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (tx_fee_amount != 0)) {
        (**(code **)(*(long *)tx_fee_amount + 8))();
      }
      tx_fee_amount = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if ((undefined1 *)gtest_ar._0_8_ != local_560) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  ret = CfdFreeHandle(handle);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fund_handle,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x756,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fund_handle,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fund_handle);
    if (gtest_ar_._0_8_ != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(cfdcapi_transaction, FundRawTransaction_Check1) {
  // from cfd-go
  struct CfdTestFundElementsUtxoVector {
    std::string txid;
    uint32_t vout;
    int64_t amount;
    std::string asset;
    std::string descriptor;
  };
  static ConfidentialAssetId exp_dummy_asset_a("aa00000000000000000000000000000000000000000000000000000000000000");
  static ConfidentialAssetId exp_dummy_asset_b("bb00000000000000000000000000000000000000000000000000000000000000");
  static ConfidentialAssetId exp_dummy_asset_c("cc00000000000000000000000000000000000000000000000000000000000000");

  static const std::vector<CfdTestFundElementsUtxoVector> kFundCoinSelectElementsTestVector3 = {
    // mnemonic: token hair neglect leader furnace obtain sadness tool you father paddle skate remain carry impact dinosaur correct essay rent illness predict mercy exist ring
    // xpriv: xprv9s21ZrQH143K4QXrTfC9L43GKCuLcDiBCWjyVqfZUTzoPJWUstD4HTJKGz1U5jAGZzKshcX6cCyZ1ZdxSUQLz92pEZWEGwxa39ks2vhTsfA
    // derive: 44h/0h/0h/0/*
    {
      "7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a",
      0,
      312500000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(0329165ca5832de80305c92d4b1415f10340d267ba05cbffcfe02d386dc5020e4d))",
    },
    {
      "30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a",
      0,
      78125000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(022db3cb17d98db6cd8d513f88b095dbe80ef9e57acd5b1d9e8bd7f24618079451))",
    },
    {
      "9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a",
      0,
      1250000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(032d04e0b1474a82ad68c0ef37e1a7cf6c75ef01b22c00882e8e4e127a942823a1))",
    },
    {
      "8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a",
      0,
      39062500,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(03a7fb569db921abf70f1b6b9ad9ac863196deecd99d606b139bba7d740d1cc5bf))",
    },
    {
      "4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a",
      0,
      156250000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(02df74fc8124ff6f3982e90afb318f3e955b10f58c4c6014b3a767e16160f811d9))",
    },
    {
      "b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b",
      0,
      2500000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(029222484db385d268a2a4604ea40fd2228401061f741ad9da8c907ba9df29c2d3))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b01",
      0,
      26918400,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(038f9011753b74fa0134d4b64a1491f99e0c4c0e16da616627c1f6a93c5e7555c0))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b02",
      0,
      750000,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(0302f567f9671b570dbcf179f3ba5f2fb381ea7e8db6ab9e0968c07d40325c3fcd))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b03",
      0,
      346430050,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(034ff60d8fb18ae88019f6f905cfaa0e1841f75edfa1f3c0a5bfaf77b796243901))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b04",
      0,
      18476350,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(029f2126cd8b55af7cc3cee8154c44de7cb7cb214809f81144d6b323d9c7a3993e))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000c01",
      0,
      37654200,
      exp_dummy_asset_c.GetHex(),
      "sh(wpkh(02f1d2c28388e3fd609ff383f022b615f1cd8a1931632706f63bfb6e253875ca03))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000c02",
      0,
      127030000,
      exp_dummy_asset_c.GetHex(),
      "sh(wpkh(02cca4482dc1e7d54c879c0d9069e3d66c3bf91b2bf46eddc74f18d76c659dfd10))",
    },
  };
  static const std::string kExpTxData = "010000000006fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000feffffff030b0000000000000000000000000000000000000000000000000000000000000000000000feffffff020b0000000000000000000000000000000000000000000000000000000000000000000000feffffff010c0000000000000000000000000000000000000000000000000000000000000000000000feffffff050100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a572430100000000000000000000000000000000000000000000000000000000000000aa01000000000000026a00000100000000000000000000000000000000000000000000000000000000000000bb010000000014b18c12001600148aff8eea7bef9ec60d35d7034b2e48e180e93c5d0100000000000000000000000000000000000000000000000000000000000000cc0100000000023e8eb800160014799a8d3f11251b6a6df4ba156a28dd64ad969a910100000000000000000000000000000000000000000000000000000000000000aa010000000006fc2142001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000";

  CfdInitialize();
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  try {
    const char* tx = "010000000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff010100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000";
    uint32_t target_asset_count = 3;
    auto fee_asset = exp_dummy_asset_a.GetHex();
    void* fund_handle = nullptr;
    ret = CfdInitializeFundRawTx(
        handle, kCfdNetworkLiquidv1, target_asset_count,
        fee_asset.c_str(), &fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_NE(nullptr, fund_handle);
    if (ret == kCfdSuccess) {
      for (const auto& test_data : kFundCoinSelectElementsTestVector3) {
        ret = CfdAddUtxoForFundRawTx(
            handle, fund_handle,
            test_data.txid.c_str(), test_data.vout,
            test_data.amount,
            test_data.descriptor.c_str(),
            test_data.asset.c_str());
        EXPECT_EQ(kCfdSuccess, ret);
      }

      ret = CfdAddTxInputForFundRawTx(handle, fund_handle,
          "9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff", 0,
          112340000,
          "sh(wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x",
          exp_dummy_asset_a.GetHex().c_str(),
          false, false, false, "", 0, 0, nullptr);
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdAddTargetAmountForFundRawTx(handle, fund_handle, 0, 115800000,
          exp_dummy_asset_a.GetHex().c_str(),
          "ex1qdnf34k9c255nfa9anjx0sj5ne0t6f80p5rne4e");
      EXPECT_EQ(kCfdSuccess, ret);
      ret = CfdAddTargetAmountForFundRawTx(handle, fund_handle, 1, 347180040,
          exp_dummy_asset_b.GetHex().c_str(),
          "ex1q3tlca6nma70vvrf46up5ktjguxqwj0zamt7ktn");
      EXPECT_EQ(kCfdSuccess, ret);
      ret = CfdAddTargetAmountForFundRawTx(handle, fund_handle, 2, 37654100,
          exp_dummy_asset_c.GetHex().c_str(),
          "ex1q0xdg60c3y5dk5m05hg2k52xavjkedx53t3k40m");
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxIsBlind,
          0, 0, true);
      EXPECT_EQ(kCfdSuccess, ret);

      int64_t tx_fee_amount = 0;
      uint32_t append_txout_count = 0;
      char* output_tx_hex = nullptr;
      double effective_fee_rate = 0.15;
      ret = CfdFinalizeFundRawTx(handle, fund_handle, tx,
          effective_fee_rate, &tx_fee_amount, &append_txout_count,
          &output_tx_hex);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_EQ(618, tx_fee_amount);
        EXPECT_EQ(3, append_txout_count);
        EXPECT_STREQ(kExpTxData.c_str(), output_tx_hex);
        CfdFreeStringBuffer(output_tx_hex);
      } else {
        ret = CfdGetLastErrorCode(handle);
        if (ret != kCfdSuccess) {
          char* str_buffer = NULL;
          ret = CfdGetLastErrorMessage(handle, &str_buffer);
          EXPECT_EQ(kCfdSuccess, ret);
          EXPECT_STREQ("", str_buffer);
          CfdFreeStringBuffer(str_buffer);
          str_buffer = NULL;
        }
      }
    }
    ret = CfdFreeFundRawTxHandle(handle, fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);

    // EXPECT_STREQ("", context.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}